

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,uint sector_edge_count)

{
  bool bVar1;
  int iVar2;
  
  if (sector_edge_count != 0) {
    iVar2 = sector_edge_count - 4;
    if (sector_edge_count < 5) {
      iVar2 = 0;
    }
    bVar1 = Internal_ReserveSubDWorkspace
                      (this,(ulong)(iVar2 * 2 + 0x10),(ulong)(iVar2 + 9),
                       (ulong)(iVar2 * 0x12 + 0x80),false);
    return bVar1;
  }
  Destroy(this);
  return true;
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  unsigned int sector_edge_count
  )
{
  if (0 == sector_edge_count)
  {
    Destroy();
    return true;
  }

  const unsigned int k = (sector_edge_count <= 4) ? 0 : (sector_edge_count - 4);
  const unsigned int v_capacity = 16 + 2 * k;
  const unsigned int f_capacity = 9 + k;
  const unsigned int p_capacity = 8*v_capacity + 2 * k;

  return Internal_ReserveSubDWorkspace(v_capacity, f_capacity, p_capacity, false);
}